

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall QPlainTextEditPrivate::adjustScrollbars(QPlainTextEditPrivate *this)

{
  undefined1 uVar1;
  long lVar2;
  QWidgetData *pQVar3;
  int iVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long in_FS_OFFSET;
  double dVar13;
  double local_a8;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                    super_QWidgetPrivate.field_0x8;
  QWidgetTextControl::document((QWidgetTextControl *)this->control);
  QTextDocument::documentLayout();
  plVar9 = (long *)QMetaObject::cast((QObject *)&QPlainTextDocumentLayout::staticMetaObject);
  uVar1 = *(undefined1 *)(plVar9[1] + 0xb9);
  *(undefined1 *)(plVar9[1] + 0xb9) = 1;
  dVar13 = (double)QTextDocument::documentMargin();
  if (((this->field_0x348 & 8) != 0) || ((*(byte *)(*(long *)(lVar2 + 0x20) + 9) & 0x80) == 0)) {
    iVar6 = QTextDocument::lineCount();
    iVar8 = 1;
    if (1 < iVar6) {
      iVar8 = iVar6;
    }
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_68,(QFont *)(*(long *)(lVar2 + 0x20) + 0x38));
    iVar7 = QFontMetrics::lineSpacing();
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_68);
    iVar6 = iVar8 + -1;
    if (iVar7 == 0) {
      iVar7 = 0;
    }
    else {
      pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      iVar7 = (((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1) / iVar7;
    }
    goto LAB_004971a3;
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::lastBlock();
  pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  iVar8 = (pQVar3->crect).y2.m_i;
  iVar6 = (pQVar3->crect).y1.m_i;
  cVar5 = QTextBlock::isValid();
  iVar7 = 0;
  if (cVar5 != '\0') {
    dVar13 = ((double)((iVar8 - iVar6) + 1) - dVar13) + -1.0;
    iVar7 = 0;
    local_a8 = 0.0;
    do {
      cVar5 = QTextBlock::isVisible();
      if (cVar5 != '\0') {
        (**(code **)(*plVar9 + 0x88))(&local_68,plVar9,&local_48);
        local_a8 = local_a8 + (double)CONCAT44(uStack_4c,uStack_50);
        iVar8 = QTextBlock::layout();
        iVar6 = QTextLayout::lineCount();
        if (dVar13 < local_a8) {
          iVar10 = 0;
          if (0 < iVar6) {
            iVar10 = iVar6;
          }
          iVar4 = 0;
          goto LAB_00497120;
        }
        iVar7 = iVar7 + iVar6;
      }
      QTextBlock::previous();
      local_48 = local_68;
      puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,puStack_60._0_4_);
      cVar5 = QTextBlock::isValid();
    } while (cVar5 != '\0');
  }
  goto LAB_0049718e;
  while( true ) {
    QTextLayout::lineAt(iVar8);
    local_58 = 0xffffffff;
    uStack_54 = 0xffffffff;
    uStack_50 = 0xffffffff;
    uStack_4c = 0xffffffff;
    local_68 = (undefined1 *)0xffffffffffffffff;
    puStack_60 = (undefined1 *)0xffffffffffffffff;
    QTextLine::naturalTextRect();
    iVar4 = iVar12 + 1;
    iVar11 = iVar12;
    if (local_a8 - dVar13 <= (double)puStack_60) break;
LAB_00497120:
    iVar12 = iVar4;
    iVar11 = iVar10;
    if (iVar10 == iVar12) break;
  }
  iVar8 = iVar6 - iVar11;
  if (iVar8 == 0 || iVar6 < iVar11) {
    iVar8 = 0;
  }
  iVar7 = iVar7 + iVar8;
LAB_0049718e:
  iVar8 = QTextDocument::lineCount();
  iVar6 = 0;
  if (0 < iVar8 - iVar7) {
    iVar6 = iVar8 - iVar7;
  }
LAB_004971a3:
  dVar13 = (double)(**(code **)(*plVar9 + 0x78))(plVar9);
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0,iVar6);
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar7);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(lVar2 + 8) + 800));
  QTextDocument::findBlockByNumber((int)&local_68);
  cVar5 = QTextBlock::isValid();
  if (cVar5 != '\0') {
    iVar6 = QTextBlock::firstLineNumber();
    iVar6 = iVar6 + this->topLine;
  }
  QAbstractSlider::setValue
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar6);
  pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0,
             ~(pQVar3->crect).x2.m_i + (int)dVar13 + (pQVar3->crect).x1.m_i);
  pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,
             ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1);
  *(undefined1 *)(plVar9[1] + 0xb9) = uVar1;
  iVar8 = QAbstractSlider::value
                    (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
  setTopLine(this,iVar8,0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::adjustScrollbars()
{
    Q_Q(QPlainTextEdit);
    QTextDocument *doc = control->document();
    QPlainTextDocumentLayout *documentLayout = qobject_cast<QPlainTextDocumentLayout*>(doc->documentLayout());
    Q_ASSERT(documentLayout);
    bool documentSizeChangedBlocked = documentLayout->priv()->blockDocumentSizeChanged;
    documentLayout->priv()->blockDocumentSizeChanged = true;
    qreal margin = doc->documentMargin();

    int vmax = 0;

    int vSliderLength = 0;
    if (!centerOnScroll && q->isVisible()) {
        QTextBlock block = doc->lastBlock();
        const qreal visible = viewport->rect().height() - margin - 1;
        qreal y = 0;
        int visibleFromBottom = 0;

        while (block.isValid()) {
            if (!block.isVisible()) {
                block = block.previous();
                continue;
            }
            y += documentLayout->blockBoundingRect(block).height();

            QTextLayout *layout = block.layout();
            int layoutLineCount = layout->lineCount();
            if (y > visible) {
                int lineNumber = 0;
                while (lineNumber < layoutLineCount) {
                    QTextLine line = layout->lineAt(lineNumber);
                    const QRectF lr = line.naturalTextRect();
                    if (lr.top() >= y - visible)
                        break;
                    ++lineNumber;
                }
                if (lineNumber < layoutLineCount)
                    visibleFromBottom += (layoutLineCount - lineNumber);
                break;

            }
            visibleFromBottom += layoutLineCount;
            block = block.previous();
        }
        vmax = qMax(0, doc->lineCount() - visibleFromBottom);
        vSliderLength = visibleFromBottom;

    } else {
        vmax = qMax(0, doc->lineCount() - 1);
        int lineSpacing = q->fontMetrics().lineSpacing();
        vSliderLength = lineSpacing != 0 ? viewport->height() / lineSpacing : 0;
    }

    QSizeF documentSize = documentLayout->documentSize();
    vbar->setRange(0, qMax(0, vmax));
    vbar->setPageStep(vSliderLength);
    int visualTopLine = vmax;
    QTextBlock firstVisibleBlock = q->firstVisibleBlock();
    if (firstVisibleBlock.isValid())
        visualTopLine = firstVisibleBlock.firstLineNumber() + topLine;

    vbar->setValue(visualTopLine);

    hbar->setRange(0, (int)documentSize.width() - viewport->width());
    hbar->setPageStep(viewport->width());
    documentLayout->priv()->blockDocumentSizeChanged = documentSizeChangedBlocked;
    setTopLine(vbar->value());
}